

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupZeroUndc(Gia_Man_t *p,char *pInit,int nNewPis,int fGiaSimple,int fVerbose)

{
  char cVar1;
  uint uVar2;
  int iLit1;
  size_t sVar3;
  void *__s;
  ulong uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pObj;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  uint local_50;
  
  uVar2 = p->nRegs;
  sVar3 = strlen(pInit);
  if (uVar2 != (uint)sVar3) {
    __assert_fail("(int)strlen(pInit) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xc39,"Gia_Man_t *Gia_ManDupZeroUndc(Gia_Man_t *, char *, int, int, int)");
  }
  iVar10 = p->vCis->nSize - uVar2;
  __s = malloc((long)(int)uVar2 << 2);
  memset(__s,0xff,(long)(int)uVar2 << 2);
  uVar4 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    if ((byte)(pInit[uVar4] | 0x20U) == 0x78) {
      *(int *)((long)__s + uVar4 * 4) = iVar10;
      iVar10 = iVar10 + 1;
    }
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  p_00->fGiaSimple = fGiaSimple;
  p->pObjs->Value = 0;
  for (iVar9 = 0; iVar11 = p->vCis->nSize - p->nRegs, iVar9 < iVar11; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCi(p,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      iVar11 = p->vCis->nSize - p->nRegs;
      break;
    }
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar2;
  }
  for (; iVar11 < iVar10; iVar11 = iVar11 + 1) {
    Gia_ManAppendCi(p_00);
  }
  iVar9 = 0;
  if (0 < nNewPis) {
    iVar9 = nNewPis;
  }
  while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
    Gia_ManAppendCi(p_00);
  }
  iVar9 = 0;
  while( true ) {
    iVar11 = p->nRegs;
    pVVar8 = p->vCis;
    if (iVar11 <= iVar9) break;
    pGVar6 = Gia_ManCi(p,(pVVar8->nSize - iVar11) + iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      pVVar8 = p->vCis;
      iVar11 = p->nRegs;
      break;
    }
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar2;
    iVar9 = iVar9 + 1;
  }
  if (pVVar8->nSize - iVar11 < iVar10) {
    iVar9 = Gia_ManAppendCi(p_00);
  }
  else {
    iVar9 = -1;
  }
  Gia_ManMarkFanoutDrivers(p);
  local_50 = 0;
  for (lVar12 = 0; lVar12 < p->nRegs; lVar12 = lVar12 + 1) {
    pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + (int)lVar12);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    cVar1 = pInit[lVar12];
    if (cVar1 != '0') {
      if ((cVar1 == 'x') || (cVar1 == 'X')) {
        if ((pGVar6->field_0x3 & 0x40) != 0) {
          uVar2 = pGVar6->Value;
          pObj = Gia_ManPi(p_00,*(int *)((long)__s + lVar12 * 4));
          iVar11 = Gia_Obj2Lit(p_00,pObj);
          uVar2 = Gia_ManAppendMux(p_00,iVar9,uVar2,iVar11);
          pGVar6->Value = uVar2;
        }
      }
      else {
        if (cVar1 != '1') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                        ,0xc5f,"Gia_Man_t *Gia_ManDupZeroUndc(Gia_Man_t *, char *, int, int, int)");
        }
        uVar2 = Abc_LitNot(pGVar6->Value);
        pGVar6->Value = uVar2;
        local_50 = local_50 + 1;
      }
    }
  }
  Gia_ManCleanMark0(p);
  free(__s);
  for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManObj(p,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iVar11 = Gia_ObjFanin0Copy(pGVar6);
      iLit1 = Gia_ObjFanin1Copy(pGVar6);
      uVar2 = Gia_ManAppendAnd(p_00,iVar11,iLit1);
      pGVar6->Value = uVar2;
    }
  }
  for (iVar9 = 0; iVar9 < p->vCos->nSize - p->nRegs; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCo(p,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar11 = Gia_ObjFanin0Copy(pGVar6);
    uVar2 = Gia_ManAppendCo(p_00,iVar11);
    pGVar6->Value = uVar2;
  }
  lVar12 = 0;
  do {
    iVar9 = p->nRegs;
    if (iVar9 <= lVar12) {
LAB_001dbc6d:
      iVar11 = p->vCis->nSize - iVar9;
      if (iVar11 < iVar10) {
        Gia_ManAppendCo(p_00,1);
        iVar9 = p->nRegs;
        iVar11 = p->vCis->nSize - iVar9;
      }
      Gia_ManSetRegNum(p_00,(uint)(iVar11 < iVar10) + iVar9);
      if (fVerbose != 0) {
        printf("Converted %d 1-valued FFs and %d DC-valued FFs.\n",(ulong)local_50,
               (ulong)(uint)((iVar10 - p->vCis->nSize) + p->nRegs));
      }
      return p_00;
    }
    pGVar6 = Gia_ManCo(p,(p->vCos->nSize - iVar9) + (int)lVar12);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      iVar9 = p->nRegs;
      goto LAB_001dbc6d;
    }
    cVar1 = pInit[lVar12];
    iVar9 = Gia_ObjFanin0Copy(pGVar6);
    if (cVar1 == '1') {
      iVar9 = Abc_LitNot(iVar9);
    }
    uVar2 = Gia_ManAppendCo(p_00,iVar9);
    pGVar6->Value = uVar2;
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupZeroUndc( Gia_Man_t * p, char * pInit, int nNewPis, int fGiaSimple, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int CountPis = Gia_ManPiNum(p), * pPiLits;
    int i, iResetFlop = -1, Count1 = 0;
    //printf( "Using %s\n", pInit );
    // map X-valued flops into new PIs
    assert( (int)strlen(pInit) == Gia_ManRegNum(p) );
    pPiLits = ABC_FALLOC( int, Gia_ManRegNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( pInit[i] == 'x' || pInit[i] == 'X' )
            pPiLits[i] = CountPis++;
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->fGiaSimple = fGiaSimple;
    Gia_ManConst0(p)->Value = 0;
    // create primary inputs
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create additional primary inputs
    for ( i = Gia_ManPiNum(p); i < CountPis; i++ )
        Gia_ManAppendCi( pNew );
    // create additional primary inputs
    for ( i = 0; i < nNewPis; i++ )
        Gia_ManAppendCi( pNew );
    // create flop outputs
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create reset flop output
    if ( CountPis > Gia_ManPiNum(p) )
        iResetFlop = Gia_ManAppendCi( pNew );
    // update flop outputs
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachRo( p, pObj, i )
    {
        if ( pInit[i] == '1' )
            pObj->Value = Abc_LitNot(pObj->Value), Count1++;
        else if ( pInit[i] == 'x' || pInit[i] == 'X' )
        {
            if ( pObj->fMark0 ) // only add MUX if the flop has fanout
                pObj->Value = Gia_ManAppendMux( pNew, iResetFlop, pObj->Value, Gia_Obj2Lit(pNew, Gia_ManPi(pNew, pPiLits[i])) );
        }
        else if ( pInit[i] != '0' )
            assert( 0 );
    }
    Gia_ManCleanMark0( p );
    ABC_FREE( pPiLits );
    // build internal nodes
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create POs
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create flop inputs
    Gia_ManForEachRi( p, pObj, i )
        if ( pInit[i] == '1' )
            pObj->Value = Gia_ManAppendCo( pNew, Abc_LitNot(Gia_ObjFanin0Copy(pObj)) );
        else
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create reset flop input
    if ( CountPis > Gia_ManPiNum(p) )
        Gia_ManAppendCo( pNew, 1 );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) + (int)(CountPis > Gia_ManPiNum(p)) );
    if ( fVerbose )
        printf( "Converted %d 1-valued FFs and %d DC-valued FFs.\n", Count1, CountPis-Gia_ManPiNum(p) );
    return pNew;
}